

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZWavyLine>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZWavyLine> *this,TPZWavyLine *geo,int matind,TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_0189a0c0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_01899d18,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_01899a18;
  pzgeom::TPZWavyLine::TPZWavyLine(&this->fGeo,geo);
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x48);
  this->fNeighbours[0].fGeoElIndex = -1;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[1].fGeoElIndex = -1;
  this->fNeighbours[1].fSide = -1;
  this->fNeighbours[2].fGeoElIndex = -1;
  this->fNeighbours[2].fSide = -1;
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TGeo &geo,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(geo) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}